

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O3

void __thiscall NetworkNS::Grid::Grid(Grid *this,double Lx,double Ly,double Lz,int nx,int ny,int nz)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  grid_cell *pgVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  double *pdVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  int local_10c;
  long local_108;
  int local_f8;
  int local_c0;
  int local_a8;
  
  this->_vptr_Grid = (_func_int **)&PTR__Grid_0010fd28;
  this->ncellx = nx;
  this->ncelly = ny;
  this->ncellz = nz;
  uVar3 = ny * nx;
  this->ncells = uVar3 * nz;
  pgVar4 = (grid_cell *)malloc((long)(int)(uVar3 * nz) * 0x90);
  this->cells = pgVar4;
  auVar38._0_8_ = (double)nx;
  auVar38._8_8_ = (double)ny;
  auVar37._8_8_ = Ly;
  auVar37._0_8_ = Lx;
  auVar38 = divpd(auVar37,auVar38);
  this->dlx = (double)auVar38._0_8_;
  this->dly = (double)auVar38._8_8_;
  dVar36 = auVar38._0_8_;
  dVar39 = auVar38._8_8_;
  auVar32._0_8_ = (double)nz;
  auVar35._8_8_ = 0x3ff0000000000000;
  auVar35._0_8_ = Lz;
  auVar32._8_8_ = dVar36;
  auVar38 = divpd(auVar35,auVar32);
  this->dlz = (double)auVar38._0_8_;
  this->idlx = (double)auVar38._8_8_;
  dVar34 = auVar38._0_8_;
  auVar33._8_8_ = dVar34;
  auVar33._0_8_ = dVar39;
  auVar38 = divpd(_DAT_0010c490,auVar33);
  this->idly = (double)auVar38._0_8_;
  this->idlz = (double)auVar38._8_8_;
  dVar31 = dVar36 * dVar39 * dVar34;
  this->vcell = dVar31;
  this->ivcell = 1.0 / dVar31;
  if (0 < nz) {
    iVar8 = 0;
    iVar10 = 0;
    do {
      if (0 < ny) {
        iVar15 = 0;
        do {
          if (0 < nx) {
            pdVar23 = pgVar4[iVar8].Vec + 2;
            iVar24 = 0;
            do {
              ((grid_cell *)(pdVar23 + -3))->Id = (iVar15 + iVar10 * ny) * nx + iVar24;
              iVar24 = iVar24 + 1;
              pdVar23[-2] = (double)iVar24 * dVar36;
              pdVar23[-1] = (double)(iVar15 + 1) * dVar39;
              *pdVar23 = (double)(iVar10 + 1) * dVar34;
              pdVar23 = pdVar23 + 0x12;
            } while (nx != iVar24);
            iVar8 = iVar8 + iVar24;
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 != ny);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != nz);
    if (0 < nz) {
      uVar26 = (ulong)(uint)nx;
      local_108 = 0;
      local_10c = 0;
      uVar5 = 0;
      do {
        uVar6 = uVar5 + 1;
        if (0 < ny) {
          uVar14 = (int)uVar5 - 1;
          if (uVar5 == 0) {
            uVar14 = nz - 1U;
          }
          local_c0 = (int)uVar6;
          iVar8 = 0;
          if (uVar5 < nz - 1U) {
            iVar8 = local_c0;
          }
          iVar10 = (int)uVar5 * ny;
          uVar9 = (ulong)(uVar3 * uVar14);
          iVar15 = uVar14 * ny;
          uVar7 = (ulong)(uVar3 * iVar8);
          iVar8 = iVar8 * ny;
          lVar19 = local_108;
          uVar5 = 0;
          do {
            uVar17 = uVar5 + 1;
            if (0 < nx) {
              local_f8 = (int)lVar19;
              piVar18 = pgVar4[local_f8].neigh + 0x1a;
              iVar24 = (int)uVar5;
              iVar12 = ny + -1;
              if (uVar5 != 0) {
                iVar12 = iVar24 + -1;
              }
              local_a8 = (int)uVar17;
              iVar16 = 0;
              if ((long)uVar5 < (long)(ny + -1)) {
                iVar16 = local_a8;
              }
              iVar20 = (iVar10 + iVar24) * nx;
              iVar21 = (iVar16 + iVar10) * nx;
              iVar13 = (iVar12 + iVar10) * nx;
              iVar27 = (iVar8 + iVar24) * nx;
              iVar22 = (iVar8 + iVar16) * nx;
              iVar30 = (iVar8 + iVar12) * nx;
              iVar24 = (iVar15 + iVar24) * nx;
              iVar29 = (iVar15 + iVar16) * nx;
              iVar28 = (iVar15 + iVar12) * nx;
              uVar5 = 0;
              do {
                uVar1 = uVar5 + 1;
                iVar25 = 0;
                if ((long)uVar5 < (long)(nx + -1)) {
                  iVar25 = (int)uVar1;
                }
                iVar2 = (int)uVar5;
                iVar11 = nx + -1;
                if (uVar1 != 1) {
                  iVar11 = iVar2 + -1;
                }
                piVar18[-0x1a] = local_f8 + iVar2;
                piVar18[-0x19] = iVar20 + iVar25;
                piVar18[-0x18] = iVar20 + iVar11;
                piVar18[-0x17] = (iVar16 + local_10c) * nx + iVar2;
                piVar18[-0x16] = (iVar12 + local_10c) * nx + iVar2;
                piVar18[-0x15] = iVar21 + iVar25;
                piVar18[-0x14] = iVar21 + iVar11;
                piVar18[-0x13] = iVar13 + iVar25;
                piVar18[-0x12] = iVar13 + iVar11;
                piVar18[-0x11] = (int)uVar7 + iVar2;
                piVar18[-0x10] = iVar27 + iVar25;
                piVar18[-0xf] = iVar27 + iVar11;
                piVar18[-0xe] = iVar22 + iVar2;
                piVar18[-0xd] = iVar30 + iVar2;
                piVar18[-0xc] = iVar22 + iVar25;
                piVar18[-0xb] = iVar22 + iVar11;
                piVar18[-10] = iVar30 + iVar25;
                piVar18[-9] = iVar30 + iVar11;
                piVar18[-8] = (int)uVar9 + iVar2;
                piVar18[-7] = iVar24 + iVar25;
                piVar18[-6] = iVar24 + iVar11;
                piVar18[-5] = iVar29 + iVar2;
                piVar18[-4] = iVar2 + iVar28;
                piVar18[-3] = iVar29 + iVar25;
                piVar18[-2] = iVar29 + iVar11;
                piVar18[-1] = iVar25 + iVar28;
                *piVar18 = iVar11 + iVar28;
                piVar18 = piVar18 + 0x24;
                uVar5 = uVar1;
              } while (uVar1 != uVar26);
            }
            uVar9 = uVar9 + uVar26;
            uVar7 = uVar7 + uVar26;
            lVar19 = lVar19 + uVar26;
            uVar5 = uVar17;
          } while (uVar17 != (uint)ny);
        }
        local_10c = local_10c + ny;
        local_108 = local_108 + (ulong)uVar3;
        uVar5 = uVar6;
      } while (uVar6 != (uint)nz);
    }
  }
  return;
}

Assistant:

Grid::Grid(double Lx, double Ly, double Lz, int nx, int ny, int nz) {

      /* Initialize the arrays with the cells: */
      ncellx = nx;
      ncelly = ny;
      ncellz = nz;
      ncells = ncellx * ncelly * ncellz;
      cells = (grid_cell*)malloc(ncells * sizeof(grid_cell));

      /*define dlx, dly, dlz and vecell: all of these are common parameters for each subcell
       *  and thus they are defined only once*/

      dlx = Lx / double(ncellx);
      idlx = 1.0 / dlx;
      dly = Ly / double(ncelly);
      idly = 1.0 / dly;
      dlz = Lz / double(ncellz);
      idlz = 1.0 / dlz;
      vcell = dlx * dly*dlz;
      ivcell = 1.0 / vcell;

      int counter = 0;
      //define Id, and the vector of each cell

      for (int k = 0; k < ncellz; k++) 

         for (int j = 0; j < ncelly; j++) 

            for (int i = 0; i < ncellx; i++) {


               cells[counter].Id = k * ncelly * ncellx + j * ncellx + i;
               cells[counter].Vec[0] = double(i + 1) * dlx;
               cells[counter].Vec[1] = double(j + 1) * dly;
               cells[counter].Vec[2] = double(k + 1) * dlz;


              
               counter = counter + 1;
            }

         

      

      //define the first neighbours of all nodes 


      int icell, jcell, kcell, klower, kupper, jlower, jupper, ilower, iupper, c_id;

      for (kcell = 0; kcell < ncellz; kcell++) {

         kupper = kcell + 1;
         if ((kcell + 1)>(ncellz - 1)) kupper = 0;
         klower = kcell - 1;
         if ((kcell - 1) < 0) klower = ncellz - 1;

         for (jcell = 0; jcell < ncelly; jcell++) {

            jupper = jcell + 1;
            if ((jcell + 1)>(ncelly - 1)) jupper = 0;
            jlower = jcell - 1;
            if ((jcell - 1) < 0) jlower = ncelly - 1;


            for (icell = 0; icell < ncellx; icell++) {

               iupper = icell + 1;
               if ((icell + 1)>(ncellx - 1)) iupper = 0;
               ilower = icell - 1;
               if ((icell - 1) < 0) ilower = ncellx - 1;

               c_id = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;

               // 1: z, y , x:
               //neigh[cell_id][0] = (kcell)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[0] = (kcell) * ncelly * ncellx + (jcell) * ncellx + icell;
               //2: same z, same y, x+
               //neigh[cell_id][1] = (kcell)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[1] = (kcell) * ncelly * ncellx + (jcell) * ncellx + iupper;
               // 3: same z, same y, x-
               //neigh[cell_id][2] = (kcell)*ncelly*ncellx + (jcell)*ncellx + ilower;  
               cells[c_id].neigh[2] = (kcell) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //4: same z, y+ , same x
               //neigh[cell_id][3] = (kcell)*ncelly*ncellx + (jupper)*ncellx + icell; 
               cells[c_id].neigh[3] = (kcell) * ncelly * ncellx + (jupper) * ncellx + icell;
               //5: same z, y- , same x
               //neigh[cell_id][4] = (kcell)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[4] = (kcell) * ncelly * ncellx + (jlower) * ncellx + icell;
               //6: same z, y+ , x+
               //neigh[cell_id][5] = (kcell)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[5] = (kcell) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //7: same z, y+ , x-
               //neigh[cell_id][6] = (kcell)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[6] = (kcell) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //8: same z, y-, x+
               //neigh[cell_id][7] = (kcell)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[7] = (kcell) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //9: same z, y-, x-
               //neigh[cell_id][8] = (kcell)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[8] = (kcell) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //10: z+1, y, x :
               //neigh[cell_id][9] = (kupper)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[9] = (kupper) * ncelly * ncellx + (jcell) * ncellx + icell;
               //11: z+1, same y, x+
               //neigh[cell_id][10] = (kupper)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[10] = (kupper) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //12: z+1, same y, x-
               //neigh[cell_id][11] = (kupper)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[11] = (kupper) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //13: z+1, y+ , same x
               //neigh[cell_id][12] = (kupper)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[12] = (kupper) * ncelly * ncellx + (jupper) * ncellx + icell;
               //14: z+1, y- , same x
               //neigh[cell_id][13] = (kupper)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[13] = (kupper) * ncelly * ncellx + (jlower) * ncellx + icell;
               //15: z+1, y+ , x+
               //neigh[cell_id][14] = (kupper)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[14] = (kupper) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //16: z+1, y+ , x-
               //neigh[cell_id][15] = (kupper)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[15] = (kupper) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //17: z+1, y-, x+
               //neigh[cell_id][16] = (kupper)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[16] = (kupper) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //18: z+1, y-, x-
               //neigh[cell_id][17] = (kupper)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[17] = (kupper) * ncelly * ncellx + (jlower) * ncellx + ilower;

               //19: z-1, y, x :
               //neigh[cell_id][18] = (klower)*ncelly*ncellx + (jcell)*ncellx + icell;
               cells[c_id].neigh[18] = (klower) * ncelly * ncellx + (jcell) * ncellx + icell;
               //20: z-1, same y, x+
               //neigh[cell_id][19] = (klower)*ncelly*ncellx + (jcell)*ncellx + iupper;
               cells[c_id].neigh[19] = (klower) * ncelly * ncellx + (jcell) * ncellx + iupper;
               //21: z-1, same y, x-
               //neigh[cell_id][20] = (klower)*ncelly*ncellx + (jcell)*ncellx + ilower;
               cells[c_id].neigh[20] = (klower) * ncelly * ncellx + (jcell) * ncellx + ilower;
               //22: z-1, y+ , same x
               //neigh[cell_id][21] = (klower)*ncelly*ncellx + (jupper)*ncellx + icell;
               cells[c_id].neigh[21] = (klower) * ncelly * ncellx + (jupper) * ncellx + icell;
               //23: z-1, y- , same x
               //neigh[cell_id][22] = (klower)*ncelly*ncellx + (jlower)*ncellx + icell;
               cells[c_id].neigh[22] = (klower) * ncelly * ncellx + (jlower) * ncellx + icell;
               //24: z-1, y+ , x+
               //neigh[cell_id][23] = (klower)*ncelly*ncellx + (jupper)*ncellx + iupper;
               cells[c_id].neigh[23] = (klower) * ncelly * ncellx + (jupper) * ncellx + iupper;
               //25: z-1, y+ , x-
               //neigh[cell_id][24] = (klower)*ncelly*ncellx + (jupper)*ncellx + ilower;
               cells[c_id].neigh[24] = (klower) * ncelly * ncellx + (jupper) * ncellx + ilower;
               //26: z-1, y-, x+
               //neigh[cell_id][25] = (klower)*ncelly*ncellx + (jlower)*ncellx + iupper;
               cells[c_id].neigh[25] = (klower) * ncelly * ncellx + (jlower) * ncellx + iupper;
               //27: z-1, y-, x-
               //neigh[cell_id][26] = (klower)*ncelly*ncellx + (jlower)*ncellx + ilower;
               cells[c_id].neigh[26] = (klower) * ncelly * ncellx + (jlower) * ncellx + ilower;

            }

         }

      }



   }